

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_setSubstString_63(UConverter *cnv,UChar *s,int32_t length,UErrorCode *err)

{
  UBool UVar1;
  UConverterType UVar2;
  uint8_t *puVar3;
  int local_470;
  int32_t local_46c;
  int32_t length8;
  int32_t cloneSize;
  uint8_t *subChars;
  UConverter *clone;
  char chars [32];
  UAlignedMemory cloneBuffer [129];
  UErrorCode *err_local;
  int32_t length_local;
  UChar *s_local;
  UConverter *cnv_local;
  
  local_46c = 0x408;
  subChars = (uint8_t *)ucnv_safeClone_63(cnv,chars + 0x18,&local_46c,err);
  ucnv_setFromUCallBack_63
            ((UConverter *)subChars,UCNV_FROM_U_CALLBACK_STOP_63,(void *)0x0,
             (UConverterFromUCallback *)0x0,(void **)0x0,err);
  local_470 = ucnv_fromUChars_63((UConverter *)subChars,(char *)&clone,0x20,s,length,err);
  ucnv_close_63((UConverter *)subChars);
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    err_local._4_4_ = length;
    if ((cnv->sharedData->impl->writeSub == (UConverterWriteSub)0x0) ||
       ((cnv->sharedData->staticData->conversionType == '\x02' &&
        (UVar2 = ucnv_MBCSGetType_63(cnv), UVar2 != UCNV_EBCDIC_STATEFUL)))) {
      _length8 = &clone;
    }
    else {
      if (0x20 < length) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        return;
      }
      _length8 = (UConverter **)s;
      if (length < 0) {
        err_local._4_4_ = u_strlen_63(s);
      }
      local_470 = err_local._4_4_ << 1;
    }
    if ((4 < local_470) && ((UChar *)cnv->subChars == cnv->subUChars)) {
      puVar3 = (uint8_t *)uprv_malloc_63(0x40);
      cnv->subChars = puVar3;
      if (cnv->subChars == (uint8_t *)0x0) {
        cnv->subChars = (uint8_t *)cnv->subUChars;
        *err = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      memset(cnv->subChars,0,0x40);
    }
    if (local_470 == 0) {
      cnv->subCharLen = '\0';
    }
    else {
      memcpy(cnv->subChars,_length8,(long)local_470);
      if (_length8 == &clone) {
        cnv->subCharLen = (int8_t)local_470;
      }
      else {
        cnv->subCharLen = -(char)err_local._4_4_;
      }
    }
    cnv->subChar1 = '\0';
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_setSubstString(UConverter *cnv,
                    const UChar *s,
                    int32_t length,
                    UErrorCode *err) {
    UAlignedMemory cloneBuffer[U_CNV_SAFECLONE_BUFFERSIZE / sizeof(UAlignedMemory) + 1];
    char chars[UCNV_ERROR_BUFFER_LENGTH];

    UConverter *clone;
    uint8_t *subChars;
    int32_t cloneSize, length8;

    /* Let the following functions check all arguments. */
    cloneSize = sizeof(cloneBuffer);
    clone = ucnv_safeClone(cnv, cloneBuffer, &cloneSize, err);
    ucnv_setFromUCallBack(clone, UCNV_FROM_U_CALLBACK_STOP, NULL, NULL, NULL, err);
    length8 = ucnv_fromUChars(clone, chars, (int32_t)sizeof(chars), s, length, err);
    ucnv_close(clone);
    if (U_FAILURE(*err)) {
        return;
    }

    if (cnv->sharedData->impl->writeSub == NULL
#if !UCONFIG_NO_LEGACY_CONVERSION
        || (cnv->sharedData->staticData->conversionType == UCNV_MBCS &&
         ucnv_MBCSGetType(cnv) != UCNV_EBCDIC_STATEFUL)
#endif
    ) {
        /* The converter is not stateful. Store the charset bytes as a fixed string. */
        subChars = (uint8_t *)chars;
    } else {
        /*
         * The converter has a non-default writeSub() function, indicating
         * that it is stateful.
         * Store the Unicode string for on-the-fly conversion for correct
         * state handling.
         */
        if (length > UCNV_ERROR_BUFFER_LENGTH) {
            /*
             * Should not occur. The converter should output at least one byte
             * per UChar, which means that ucnv_fromUChars() should catch all
             * overflows.
             */
            *err = U_BUFFER_OVERFLOW_ERROR;
            return;
        }
        subChars = (uint8_t *)s;
        if (length < 0) {
            length = u_strlen(s);
        }
        length8 = length * U_SIZEOF_UCHAR;
    }

    /*
     * For storing the substitution string, select either the small buffer inside
     * UConverter or allocate a subChars buffer.
     */
    if (length8 > UCNV_MAX_SUBCHAR_LEN) {
        /* Use a separate buffer for the string. Outside UConverter to not make it too large. */
        if (cnv->subChars == (uint8_t *)cnv->subUChars) {
            /* Allocate a new buffer for the string. */
            cnv->subChars = (uint8_t *)uprv_malloc(UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
            if (cnv->subChars == NULL) {
                cnv->subChars = (uint8_t *)cnv->subUChars;
                *err = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            uprv_memset(cnv->subChars, 0, UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
        }
    }

    /* Copy the substitution string into the UConverter or its subChars buffer. */
    if (length8 == 0) {
        cnv->subCharLen = 0;
    } else {
        uprv_memcpy(cnv->subChars, subChars, length8);
        if (subChars == (uint8_t *)chars) {
            cnv->subCharLen = (int8_t)length8;
        } else /* subChars == s */ {
            cnv->subCharLen = (int8_t)-length;
        }
    }

    /* See comment in ucnv_setSubstChars(). */
    cnv->subChar1 = 0;
}